

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderMoveToAttribute(xmlTextReaderPtr reader,xmlChar *name)

{
  int iVar1;
  int iVar2;
  xmlChar *str2;
  xmlNodePtr pxVar3;
  xmlChar *prefix;
  xmlChar *local_28;
  
  local_28 = (xmlChar *)0x0;
  if (name == (xmlChar *)0x0 || reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  if (reader->node == (xmlNodePtr)0x0) {
    return -1;
  }
  iVar2 = 0;
  if (reader->node->type != XML_ELEMENT_NODE) {
    return 0;
  }
  str2 = xmlSplitQName2(name,&local_28);
  if (str2 == (xmlChar *)0x0) {
    iVar2 = xmlStrEqual(name,"xmlns");
    if (iVar2 == 0) {
      pxVar3 = (xmlNodePtr)reader->node->properties;
      while( true ) {
        if (pxVar3 == (xmlNodePtr)0x0) {
          return 0;
        }
        iVar2 = xmlStrEqual(pxVar3->name,name);
        if ((iVar2 != 0) && ((pxVar3->ns == (xmlNs *)0x0 || (pxVar3->ns->prefix == (xmlChar *)0x0)))
           ) break;
        pxVar3 = pxVar3->next;
      }
      reader->curnode = pxVar3;
    }
    else {
      pxVar3 = (xmlNodePtr)&reader->node->nsDef;
      do {
        pxVar3 = (xmlNodePtr)pxVar3->_private;
        if (pxVar3 == (xmlNodePtr)0x0) {
          return 0;
        }
      } while (pxVar3->children != (_xmlNode *)0x0);
      reader->curnode = pxVar3;
    }
    return 1;
  }
  iVar1 = xmlStrEqual(local_28,"xmlns");
  if (iVar1 == 0) {
    for (pxVar3 = (xmlNodePtr)reader->node->properties; pxVar3 != (xmlNodePtr)0x0;
        pxVar3 = pxVar3->next) {
      iVar1 = xmlStrEqual(pxVar3->name,str2);
      if (((iVar1 != 0) && (pxVar3->ns != (xmlNs *)0x0)) &&
         (iVar1 = xmlStrEqual(pxVar3->ns->prefix,local_28), iVar1 != 0)) goto LAB_001a3884;
    }
  }
  else {
    for (pxVar3 = (xmlNodePtr)reader->node->nsDef; pxVar3 != (xmlNodePtr)0x0;
        pxVar3 = (xmlNodePtr)pxVar3->_private) {
      if ((pxVar3->children != (_xmlNode *)0x0) &&
         (iVar1 = xmlStrEqual((xmlChar *)pxVar3->children,str2), iVar1 != 0)) goto LAB_001a3884;
    }
  }
  (*xmlFree)(str2);
LAB_001a389e:
  if (local_28 != (xmlChar *)0x0) {
    (*xmlFree)(local_28);
  }
  return iVar2;
LAB_001a3884:
  reader->curnode = pxVar3;
  (*xmlFree)(str2);
  iVar2 = 1;
  goto LAB_001a389e;
}

Assistant:

int
xmlTextReaderMoveToAttribute(xmlTextReaderPtr reader, const xmlChar *name) {
    xmlChar *prefix = NULL;
    xmlChar *localname;
    xmlNsPtr ns;
    xmlAttrPtr prop;

    if ((reader == NULL) || (name == NULL))
	return(-1);
    if (reader->node == NULL)
	return(-1);

    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(0);

    localname = xmlSplitQName2(name, &prefix);
    if (localname == NULL) {
	/*
	 * Namespace default decl
	 */
	if (xmlStrEqual(name, BAD_CAST "xmlns")) {
	    ns = reader->node->nsDef;
	    while (ns != NULL) {
		if (ns->prefix == NULL) {
		    reader->curnode = (xmlNodePtr) ns;
		    return(1);
		}
		ns = ns->next;
	    }
	    return(0);
	}

	prop = reader->node->properties;
	while (prop != NULL) {
	    /*
	     * One need to have
	     *   - same attribute names
	     *   - and the attribute carrying that namespace
	     */
	    if ((xmlStrEqual(prop->name, name)) &&
		((prop->ns == NULL) || (prop->ns->prefix == NULL))) {
		reader->curnode = (xmlNodePtr) prop;
		return(1);
	    }
	    prop = prop->next;
	}
	return(0);
    }

    /*
     * Namespace default decl
     */
    if (xmlStrEqual(prefix, BAD_CAST "xmlns")) {
	ns = reader->node->nsDef;
	while (ns != NULL) {
	    if ((ns->prefix != NULL) && (xmlStrEqual(ns->prefix, localname))) {
		reader->curnode = (xmlNodePtr) ns;
		goto found;
	    }
	    ns = ns->next;
	}
	goto not_found;
    }
    prop = reader->node->properties;
    while (prop != NULL) {
	/*
	 * One need to have
	 *   - same attribute names
	 *   - and the attribute carrying that namespace
	 */
	if ((xmlStrEqual(prop->name, localname)) &&
	    (prop->ns != NULL) && (xmlStrEqual(prop->ns->prefix, prefix))) {
	    reader->curnode = (xmlNodePtr) prop;
	    goto found;
	}
	prop = prop->next;
    }
not_found:
    if (localname != NULL)
        xmlFree(localname);
    if (prefix != NULL)
        xmlFree(prefix);
    return(0);

found:
    if (localname != NULL)
        xmlFree(localname);
    if (prefix != NULL)
        xmlFree(prefix);
    return(1);
}